

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky_blk(TPZSkylMatrix<double> *this,int64_t blk_sz)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  char cVar5;
  double **ppdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  int iVar16;
  int extraout_var;
  long lVar18;
  ostream *poVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong uVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  long local_a8;
  long local_a0;
  long local_98;
  long lVar17;
  
  cVar5 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar5 != '\0') {
    if (cVar5 == '\x03') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("int TPZSkylMatrix<double>::Decompose_Cholesky_blk(int64_t) [TVar = double]",
               "Decompose_Cholesky <Matrix already Decomposed>");
  }
  iVar16 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
             [0xc])();
  lVar17 = CONCAT44(extraout_var,iVar16);
  if (lVar17 != 0 && -1 < extraout_var) {
    lVar20 = 1;
    lVar34 = -8;
    lVar18 = 8;
    dVar54 = 0.0;
    lVar25 = 0;
    auVar52 = _DAT_014d28b0;
    auVar53 = _DAT_014d28c0;
    do {
      lVar2 = lVar25 + blk_sz;
      lVar35 = lVar2;
      if (lVar17 < lVar2) {
        lVar35 = lVar17;
      }
      lVar35 = lVar35 + lVar25;
      lVar21 = lVar25;
      local_a8 = lVar34;
      local_a0 = lVar20;
      local_98 = lVar18;
      do {
        ppdVar6 = (this->fElem).fStore;
        pdVar7 = ppdVar6[lVar21];
        pdVar8 = ppdVar6[lVar21 + 1];
        if ((long)pdVar8 - (long)pdVar7 == 0) {
          return 0;
        }
        lVar27 = (long)pdVar8 - (long)pdVar7 >> 3;
        lVar1 = lVar21 + 1;
        lVar24 = lVar1 - lVar27;
        if (lVar24 < lVar25) {
          lVar24 = lVar25;
        }
        lVar26 = lVar21;
        if (lVar35 < lVar21) {
          lVar26 = lVar35;
        }
        if (lVar24 < lVar26) {
          lVar27 = local_a0 - lVar27;
          if (lVar27 < lVar25) {
            lVar27 = lVar25;
          }
          uVar28 = (ulong)((long)pdVar8 + ((lVar27 * 8 + local_a8) - (long)pdVar7)) >> 3;
          lVar27 = local_98 + lVar27 * -8 + (long)pdVar7;
          uVar23 = uVar28 & 0xffffffff;
          iVar16 = 0;
          pdVar22 = ppdVar6[lVar24];
          do {
            pdVar3 = pdVar7 + (lVar21 - lVar24);
            pdVar9 = ppdVar6[lVar24 + 1];
            uVar31 = (ulong)((long)pdVar9 + (-8 - (long)pdVar22)) >> 3;
            uVar30 = (uint)uVar31;
            uVar33 = (uint)((ulong)((long)pdVar8 + (-8 - (long)pdVar3)) >> 3);
            if (uVar30 < uVar33) {
              uVar33 = uVar30;
            }
            if (uVar33 == 0) {
              dVar36 = 0.0;
            }
            else {
              uVar32 = (ulong)(uint)((int)uVar28 + iVar16);
              uVar31 = uVar31 & 0xffffffff;
              if (uVar31 <= uVar32) {
                uVar32 = uVar31;
              }
              lVar29 = uVar32 - 1;
              auVar37._8_4_ = (int)lVar29;
              auVar37._0_8_ = lVar29;
              auVar37._12_4_ = (int)((ulong)lVar29 >> 0x20);
              if (uVar23 < uVar31) {
                uVar31 = uVar23;
              }
              auVar37 = auVar37 ^ auVar53;
              uVar32 = 0;
              dVar36 = 0.0;
              dVar4 = -0.0;
              do {
                dVar15 = dVar4;
                dVar14 = dVar36;
                auVar39._8_4_ = (int)uVar32;
                auVar39._0_8_ = uVar32;
                auVar39._12_4_ = (int)(uVar32 >> 0x20);
                auVar39 = (auVar39 | auVar52) ^ auVar53;
                auVar47._0_4_ = -(uint)(auVar37._0_4_ < auVar39._0_4_);
                auVar47._4_4_ = -(uint)(auVar37._4_4_ < auVar39._4_4_);
                auVar47._8_4_ = -(uint)(auVar37._8_4_ < auVar39._8_4_);
                auVar47._12_4_ = -(uint)(auVar37._12_4_ < auVar39._12_4_);
                auVar40._4_4_ = -(uint)(auVar39._4_4_ == auVar37._4_4_);
                auVar40._12_4_ = -(uint)(auVar39._12_4_ == auVar37._12_4_);
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar41._4_4_ = auVar47._4_4_;
                auVar41._0_4_ = auVar47._4_4_;
                auVar41._8_4_ = auVar47._12_4_;
                auVar41._12_4_ = auVar47._12_4_;
                auVar39 = auVar40 & auVar47 | auVar41;
                dVar36 = dVar14;
                dVar4 = dVar15;
                if ((~auVar39._0_4_ & 1) != 0) {
                  dVar36 = *(double *)(lVar27 + uVar32 * 8);
                  dVar4 = 0.0;
                  in_XMM6._8_8_ = 0;
                  in_XMM6._0_8_ = pdVar22[uVar32 + 1];
                }
                if (((auVar39._8_2_ ^ 0xffff) & 1) != 0) {
                  dVar4 = *(double *)(lVar27 + 8 + uVar32 * 8);
                  in_XMM6._8_8_ = pdVar22[uVar32 + 2];
                }
                dVar36 = dVar36 * in_XMM6._0_8_ + dVar14;
                dVar4 = dVar4 * in_XMM6._8_8_ + dVar15;
                uVar32 = uVar32 + 2;
              } while ((uVar31 + 1 & 0xfffffffffffffffe) != uVar32);
              auVar38._4_4_ = auVar47._0_4_;
              auVar38._0_4_ = auVar47._0_4_;
              auVar38._8_4_ = auVar47._8_4_;
              auVar38._12_4_ = auVar47._8_4_;
              auVar41 = auVar40 & auVar38 | auVar41;
              uVar32 = auVar41._0_8_;
              uVar46 = auVar41._8_8_;
              uVar31 = (ulong)dVar15 & uVar46;
              auVar42._0_8_ = ~uVar32 & (ulong)dVar36;
              auVar42._8_8_ = ~uVar46 & (ulong)dVar4;
              auVar10._8_4_ = (int)uVar31;
              auVar10._0_8_ = (ulong)dVar14 & uVar32;
              auVar10._12_4_ = (int)(uVar31 >> 0x20);
              dVar36 = SUB168(auVar42 | auVar10,8) + SUB168(auVar42 | auVar10,0);
            }
            lVar24 = lVar24 + 1;
            *pdVar3 = (*pdVar3 - dVar36) / dVar54;
            iVar16 = iVar16 + 1;
            lVar27 = lVar27 + -8;
            uVar23 = (ulong)((int)uVar23 + 1);
            pdVar22 = pdVar9;
          } while (lVar24 < lVar26);
        }
        if (lVar21 <= lVar35) {
          dVar54 = 0.0;
          if (pdVar7 + 1 < pdVar8) {
            pdVar22 = pdVar7 + 2;
            if (pdVar7 + 2 < pdVar8) {
              pdVar22 = pdVar8;
            }
            uVar23 = (long)pdVar22 + (-9 - (long)pdVar7);
            uVar33 = (uint)(uVar23 >> 0x20);
            auVar49 = ZEXT816(0x8000000000000000) << 0x40;
            uVar28 = 0;
            do {
              dVar54 = auVar49._0_8_;
              dVar36 = auVar49._8_8_;
              auVar43._8_4_ = (int)uVar28;
              auVar43._0_8_ = uVar28;
              auVar43._12_4_ = (int)(uVar28 >> 0x20);
              auVar11._4_4_ = uVar33 >> 3;
              auVar11._0_4_ = (int)(uVar23 >> 3);
              auVar11._8_4_ = (int)(uVar23 >> 3);
              auVar11._12_4_ = uVar33 >> 3;
              auVar50 = auVar11 ^ auVar53;
              auVar37 = (auVar43 | auVar52) ^ auVar53;
              auVar48._0_4_ = -(uint)(auVar50._0_4_ < auVar37._0_4_);
              auVar48._4_4_ = -(uint)(auVar50._4_4_ < auVar37._4_4_);
              auVar48._8_4_ = -(uint)(auVar50._8_4_ < auVar37._8_4_);
              auVar48._12_4_ = -(uint)(auVar50._12_4_ < auVar37._12_4_);
              auVar44._4_4_ = -(uint)(auVar37._4_4_ == auVar50._4_4_);
              auVar44._12_4_ = -(uint)(auVar37._12_4_ == auVar50._12_4_);
              auVar44._0_4_ = auVar44._4_4_;
              auVar44._8_4_ = auVar44._12_4_;
              auVar51._4_4_ = auVar48._4_4_;
              auVar51._0_4_ = auVar48._4_4_;
              auVar51._8_4_ = auVar48._12_4_;
              auVar51._12_4_ = auVar48._12_4_;
              auVar51 = auVar44 & auVar48 | auVar51;
              if ((~auVar51._0_4_ & 1) != 0) {
                auVar50._8_8_ = 0;
                auVar50._0_8_ = pdVar7[uVar28 + 1];
              }
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              in_XMM6 = auVar51 ^ auVar13;
              if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                auVar50._8_8_ = pdVar7[uVar28 + 2];
              }
              auVar49._0_8_ = auVar50._0_8_ * auVar50._0_8_ + dVar54;
              auVar49._8_8_ = auVar50._8_8_ * auVar50._8_8_ + dVar36;
              uVar28 = uVar28 + 2;
            } while (((uVar23 >> 3) + 2 & 0xfffffffffffffffe) != uVar28);
            auVar12._4_4_ = auVar48._0_4_;
            auVar12._0_4_ = auVar48._0_4_;
            auVar12._8_4_ = auVar48._8_4_;
            auVar12._12_4_ = auVar48._8_4_;
            auVar45._4_4_ = auVar48._4_4_;
            auVar45._0_4_ = auVar48._4_4_;
            auVar45._8_4_ = auVar48._12_4_;
            auVar45._12_4_ = auVar48._12_4_;
            auVar45 = auVar44 & auVar12 | auVar45;
            uVar28 = auVar45._0_8_;
            uVar23 = auVar45._8_8_;
            dVar54 = (double)(~uVar23 & (ulong)auVar49._8_8_ | (ulong)dVar36 & uVar23) +
                     (double)(~uVar28 & (ulong)auVar49._0_8_ | (ulong)dVar54 & uVar28);
          }
          dVar54 = *pdVar7 - dVar54;
          if ((dVar54 < 0.0) || (ABS(dVar54) < 1e-12)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida",0x41);
            poVar19 = std::ostream::_M_insert<double>(dVar54);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
            return 0;
          }
          if (dVar54 < 0.0) {
            dVar36 = sqrt(dVar54);
            auVar52 = _DAT_014d28b0;
            auVar53 = _DAT_014d28c0;
          }
          else {
            dVar36 = SQRT(dVar54);
          }
          *pdVar7 = dVar36;
        }
        local_a8 = local_a8 + -8;
        local_a0 = local_a0 + 1;
        local_98 = local_98 + 8;
        lVar21 = lVar1;
      } while (lVar1 < lVar17);
      lVar34 = lVar34 + blk_sz * -8;
      lVar20 = lVar20 + blk_sz;
      lVar18 = lVar18 + blk_sz * 8;
      lVar25 = lVar2;
    } while (lVar2 < lVar17);
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x03';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\x01';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky_blk(int64_t blk_sz)
{
    if(this->fDecomposed == ECholesky) 
        return 1;
    if (this->fDecomposed )  
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
    TVar pivot = (TVar)0.;
    TVar minpivot = 10000.;
    int64_t dimension = this->Dim();
    
    for (int64_t blk_i = 0; blk_i < dimension; blk_i += blk_sz) {
        int64_t first_row = blk_i;
        int64_t first_col = blk_i;
        int64_t last_row  = blk_i + MIN(dimension,blk_i+blk_sz);
        
        // Compute band inner nodes
        for ( int64_t j = first_col; j < dimension; j++) {
            
            if (Size(j) == 0)   
                return( 0 ); // Size of column cannot be zero.
            
            int64_t first_i = MAX(first_row, (j+1)-Size(j));
            int64_t last_i = MIN(last_row, j); // j-1 becase we do not need to compute u(j,j)
            for ( int64_t i = first_i; i < last_i; i++) {
                
                // Compute u(i,j) = (a_ij - SUM_k_1_to_i-1 (u_ki * u_kj) ) / uii 
                
                //	TVar  u_ii = fElem[i][0];
                int64_t I = j-i; // fElem[j][I] = A(i,j) I = j-i
                TVar* u_ij = &fElem[j][I];
                
                TVar sum = 0.0;
                TVar *elem_kj = u_ij+1;
                TVar *end_kj  = fElem[j+1];
                TVar *elem_ki = &fElem[i][1];
                TVar *end_ki  = fElem[i+1];
                
                // Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
                sum = 0.0;
                
                unsigned max_l = end_kj - elem_kj;
                unsigned tmp = end_ki - elem_ki;
                if (tmp < max_l) max_l = tmp;
#pragma clang loop vectorize_width(2)
                for(unsigned l=0; l<max_l; l++)
                    sum += (*elem_kj++) * (*elem_ki++);
                
                *u_ij = (*u_ij - sum) / pivot;
            } 
            
            // After computing all the elements of this column, compute the diagonal (ujj)
            if (last_i == j)
            {
                TVar sum = 0.0;
                TVar* u_jj = &fElem[j][0];
                TVar *elem_k = fElem[j]+1;
                TVar *end_k  = fElem[j+1];
#pragma clang loop vectorize_width(2)
                for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
                pivot = *u_jj - sum;
                
                minpivot = minpivot < pivot ? minpivot : pivot;
                
                if ( pivot < ((TVar)0.) || IsZero(pivot) ) {
                    cout << "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida" << pivot << endl;
                    return( 0 );
                }
                // Valor do elemento da diagonal k,k
                *u_jj = sqrt( pivot );
            }
        }
    }	
    this->fDecomposed  = ECholesky;
    this->fDefPositive = 1;
    return( 1 );
}